

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
          (btAlignedObjectArray<btConvexHullInternal::Vertex_*> *this,Vertex **_Val)

{
  uint uVar1;
  Vertex **ppVVar2;
  ulong uVar3;
  int iVar4;
  
  uVar1 = this->m_size;
  if (uVar1 == this->m_capacity) {
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar4) {
      if (iVar4 == 0) {
        ppVVar2 = (Vertex **)0x0;
      }
      else {
        ppVVar2 = (Vertex **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
        uVar1 = this->m_size;
      }
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          ppVVar2[uVar3] = this->m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      if ((this->m_data != (Vertex **)0x0) && (this->m_ownsMemory == true)) {
        btAlignedFreeInternal(this->m_data);
        uVar1 = this->m_size;
      }
      this->m_ownsMemory = true;
      this->m_data = ppVVar2;
      this->m_capacity = iVar4;
    }
  }
  this->m_data[(int)uVar1] = *_Val;
  this->m_size = uVar1 + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}